

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

void trt_pose::parse::munkresStep5
               (float *cost_graph,int M,CoverTable *cover_table,int nrows,int ncols)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  bool bVar7;
  int j;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  uVar4 = (ulong)(uint)nrows;
  uVar5 = (ulong)(uint)ncols;
  if (0 < nrows) {
    uVar3 = 0;
    bVar7 = false;
    pfVar6 = cost_graph;
    in_XMM0_Da = in_XMM1_Da;
    do {
      if (0 < ncols) {
        uVar2 = 0;
        do {
          if (((1L << ((byte)uVar3 & 0x3f) &
               (cover_table->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6]) == 0) &&
             (((cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
               (uVar2 & 0x3f) & 1) == 0)) {
            if (bVar7) {
              if (pfVar6[uVar2] < in_XMM0_Da) {
                in_XMM0_Da = pfVar6[uVar2];
              }
            }
            else {
              in_XMM0_Da = pfVar6[uVar2];
              bVar7 = true;
            }
          }
          uVar2 = uVar2 + 1;
        } while (uVar5 != uVar2);
      }
      uVar3 = uVar3 + 1;
      pfVar6 = pfVar6 + M;
    } while (uVar3 != uVar4);
  }
  if (0 < nrows) {
    p_Var1 = (cover_table->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 0;
    pfVar6 = cost_graph;
    do {
      if ((p_Var1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0 && 0 < ncols) {
        uVar2 = 0;
        do {
          pfVar6[uVar2] = pfVar6[uVar2] + in_XMM0_Da;
          uVar2 = uVar2 + 1;
        } while (uVar5 != uVar2);
      }
      uVar3 = uVar3 + 1;
      pfVar6 = pfVar6 + M;
    } while (uVar3 != uVar4);
  }
  if (0 < ncols) {
    p_Var1 = (cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 0;
    do {
      uVar2 = uVar4;
      pfVar6 = cost_graph;
      if ((p_Var1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0 && 0 < nrows) {
        do {
          *pfVar6 = *pfVar6 - in_XMM0_Da;
          uVar2 = uVar2 - 1;
          pfVar6 = pfVar6 + M;
        } while (uVar2 != 0);
      }
      uVar3 = uVar3 + 1;
      cost_graph = cost_graph + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void munkresStep5(float *cost_graph, const int M, const CoverTable &cover_table,
                  const int nrows, const int ncols) {
  bool valid = false;
  float min;
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!cover_table.isCovered(i, j)) {
        if (!valid) {
          min = cost_graph[i * M + j];
          valid = true;
        } else if (cost_graph[i * M + j] < min) {
          min = cost_graph[i * M + j];
        }
      }
    }
  }

  for (int i = 0; i < nrows; i++) {
    if (cover_table.isRowCovered(i)) {
      for (int j = 0; j < ncols; j++) {
        cost_graph[i * M + j] += min;
      }
      //       cost_graph.addToRow(i, min);
    }
  }
  for (int j = 0; j < ncols; j++) {
    if (!cover_table.isColCovered(j)) {
      for (int i = 0; i < nrows; i++) {
        cost_graph[i * M + j] -= min;
      }
      //       cost_graph.addToCol(j, -min);
    }
  }
}